

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsFieldDependent(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  OneofDescriptor *pOVar4;
  FieldDescriptor *field_00;
  FileDescriptor *pFVar5;
  Descriptor *pDVar6;
  FileDescriptor *pFVar7;
  int local_24;
  int i;
  Descriptor *map_descriptor;
  FieldDescriptor *field_local;
  
  pOVar4 = FieldDescriptor::containing_oneof(field);
  if ((pOVar4 != (OneofDescriptor *)0x0) &&
     (CVar2 = FieldDescriptor::cpp_type(field), CVar2 == CPPTYPE_STRING)) {
    return true;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pDVar6 = FieldDescriptor::message_type(field);
    for (local_24 = 0; iVar3 = Descriptor::field_count(pDVar6), local_24 < iVar3;
        local_24 = local_24 + 1) {
      field_00 = Descriptor::field(pDVar6,local_24);
      bVar1 = IsFieldDependent(field_00);
      if (bVar1) {
        return true;
      }
    }
    field_local._7_1_ = false;
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 == CPPTYPE_MESSAGE) {
      pOVar4 = FieldDescriptor::containing_oneof(field);
      if (pOVar4 == (OneofDescriptor *)0x0) {
        pFVar5 = FieldDescriptor::file(field);
        pDVar6 = FieldDescriptor::message_type(field);
        pFVar7 = Descriptor::file(pDVar6);
        if (pFVar5 == pFVar7) {
          field_local._7_1_ = false;
        }
        else {
          field_local._7_1_ = true;
        }
      }
      else {
        field_local._7_1_ = true;
      }
    }
    else {
      field_local._7_1_ = false;
    }
  }
  return field_local._7_1_;
}

Assistant:

bool IsFieldDependent(const FieldDescriptor* field) {
  if (field->containing_oneof() != NULL &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    return true;
  }
  if (field->is_map()) {
    const Descriptor* map_descriptor = field->message_type();
    for (int i = 0; i < map_descriptor->field_count(); i++) {
      if (IsFieldDependent(map_descriptor->field(i))) {
        return true;
      }
    }
    return false;
  }
  if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    return false;
  }
  if (field->containing_oneof() != NULL) {
    // Oneof fields will always be dependent.
    //
    // This is a unique case for field codegen. Field generators are
    // responsible for generating all the field-specific accessor
    // functions, except for the clear_*() function; instead, field
    // generators produce inline clearing code.
    //
    // For non-oneof fields, the Message class uses the inline clearing
    // code to define the field's clear_*() function, as well as in the
    // destructor. For oneof fields, the Message class generates a much
    // more complicated clear_*() function, which clears only the oneof
    // member that is set, in addition to clearing methods for each of the
    // oneof members individually.
    //
    // Since oneofs do not have their own generator class, the Message code
    // generation logic would be significantly complicated in order to
    // split dependent and non-dependent manipulation logic based on
    // whether the oneof truly needs to be dependent; so, for oneof fields,
    // we just assume it (and its constituents) should be manipulated by a
    // dependent base class function.
    //
    // This is less precise than how dependent message-typed fields are
    // handled, but the cost is limited to only the generated code for the
    // oneof field, which seems like an acceptable tradeoff.
    return true;
  }
  if (field->file() == field->message_type()->file()) {
    return false;
  }
  return true;
}